

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMoveSrEa<(moira::Instr)75,(moira::Mode)5,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  Ea<(moira::Mode)5,_2> dst;
  u32 local_1c;
  ushort local_18;
  uint local_14;
  
  local_18 = op & 7;
  local_1c = *addr;
  *addr = local_1c + 2;
  local_14 = (*this->_vptr_Moira[6])();
  local_14 = local_14 & 0xffff;
  if (str->style->syntax == MUSASHI) {
    cVar3 = 'm';
    lVar5 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = "fdmove"[lVar5 + 3];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar1 = (str->tab).raw;
      pcVar4 = str->ptr;
      do {
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        pcVar4 = str->ptr;
      } while (pcVar4 < str->base + iVar1);
      goto LAB_00241ce8;
    }
  }
  else {
    cVar3 = 'm';
    lVar5 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = "fdmove"[lVar5 + 3];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pcVar4 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar4 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar4 = '.';
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
    }
    *pcVar4 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar1 = (str->tab).raw;
      pcVar4 = str->ptr;
      do {
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        pcVar4 = str->ptr;
      } while (pcVar4 < str->base + iVar1);
      goto LAB_00241ce8;
    }
  }
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ' ';
LAB_00241ce8:
  StrWriter::operator<<(str);
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)5,_2> *)&local_1c);
  return;
}

Assistant:

void
Moira::dasmMoveSrEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Op<M, S>( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Sr{} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Sr{} << Sep{} << dst;
    }
}